

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_stream.cpp
# Opt level: O3

void __thiscall
create::SerialStream::SerialStream
          (SerialStream *this,shared_ptr<create::Data> *d,uint8_t *header,
          bool install_signal_handler)

{
  shared_ptr<create::Data> local_20;
  
  local_20.super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (d->super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_20.super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (d->super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_20.super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20.super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_20.super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20.super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_20.super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  Serial::Serial(&this->super_Serial,&local_20,install_signal_handler);
  if (local_20.super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  (this->super_Serial)._vptr_Serial = (_func_int **)&PTR_startSensorStream_001572b8;
  this->readState = READ_HEADER;
  this->headerByte = *header;
  return;
}

Assistant:

SerialStream::SerialStream(std::shared_ptr<Data> d, const uint8_t& header, bool install_signal_handler) : Serial(d, install_signal_handler), readState(READ_HEADER), headerByte(header) {
  }